

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_io_load
          (CompilerMSL *this,uint32_t result_type_id,uint32_t id,uint32_t ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Types TVar2;
  string *psVar3;
  bool bVar4;
  bool bVar5;
  ExecutionModel EVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  SPIRType *pSVar10;
  SPIRType *pSVar11;
  undefined4 extraout_var;
  undefined8 *puVar12;
  undefined4 extraout_var_00;
  long *plVar13;
  ulong uVar14;
  SPIRVariable *var;
  runtime_error *prVar15;
  size_type *psVar16;
  ulong *puVar17;
  CompilerMSL *pCVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  AccessChainMeta meta;
  string expr;
  uint32_t indices [2];
  string local_140;
  SPIRType *local_120;
  undefined1 local_118 [16];
  ulong local_108;
  long lStack_100;
  uint32_t local_f4;
  CompilerMSL *local_f0;
  ulong local_e8;
  uint32_t local_dc;
  SPIRType *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  uint32_t local_6c;
  SPIRType *local_68;
  SPIRType *local_60;
  uint32_t local_54;
  SPIRType *local_50;
  uint32_t local_44;
  SPIRVariable *local_40;
  ulong local_38;
  
  local_54 = id;
  pSVar10 = Compiler::expression_type((Compiler *)this,ptr);
  pSVar11 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + result_type_id);
  local_50 = pSVar10;
  if (((pSVar10->storage != StorageClassInput) &&
      ((pSVar10->storage != StorageClassOutput ||
       (EVar6 = Compiler::get_execution_model((Compiler *)this),
       EVar6 == ExecutionModelTessellationEvaluation)))) ||
     (bVar4 = Compiler::has_decoration((Compiler *)this,(ID)ptr,DecorationPatch), bVar4)) {
    return false;
  }
  TVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
          ptr[ptr].type;
  local_120 = pSVar11;
  local_44 = result_type_id;
  bVar4 = variable_storage_requires_stage_io(this,local_50->storage);
  pSVar10 = local_120;
  local_f0 = this;
  local_dc = ptr;
  if (bVar4) {
    bVar5 = Compiler::is_matrix((Compiler *)this,local_120);
    bVar23 = true;
    if ((!bVar5) && (bVar5 = Compiler::is_array((Compiler *)this,pSVar10), !bVar5)) {
      bVar23 = pSVar10->basetype == Struct;
    }
  }
  else {
    bVar23 = false;
  }
  uVar8 = local_dc;
  if (TVar2 == TypeVariable) {
    bVar5 = Compiler::is_array((Compiler *)local_f0,pSVar10);
    if (!bVar5 && !bVar23) {
      return false;
    }
  }
  else if (!bVar23) {
    return false;
  }
  pCVar18 = local_f0;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  uVar7 = Compiler::get_extended_decoration
                    ((Compiler *)local_f0,uVar8,SPIRVCrossDecorationInterfaceMemberIndex);
  local_e8 = CONCAT44(extraout_var,uVar7);
  local_40 = Compiler::maybe_get_backing_variable((Compiler *)pCVar18,uVar8);
  local_68 = Compiler::get_pointee_type((Compiler *)pCVar18,(local_50->super_IVariant).self.id);
  local_60 = Compiler::expression_type((Compiler *)pCVar18,(pCVar18->stage_in_ptr_var_id).id);
  pCVar18 = local_f0;
  if (bVar4) {
    uVar22 = (local_120->array).super_VectorView<unsigned_int>.buffer_size;
    if (2 < uVar22) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar15,"Cannot load tessellation IO variables with more than 2 dimensions.");
      goto LAB_001ca2ac;
    }
    if (uVar22 == 2) {
      if (TVar2 != TypeVariable) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar15,"Loading an array-of-array must be loaded directly from an IO variable.")
        ;
        goto LAB_001ca2ac;
      }
      if ((int)local_e8 == -1) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(prVar15,"Interface index is unknown. Cannot continue.");
        goto LAB_001ca2ac;
      }
      if (local_120->basetype != Struct) {
        bVar4 = Compiler::is_matrix((Compiler *)local_f0,local_120);
        if (!bVar4) {
          (*(pCVar18->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_118,pCVar18,local_120,0);
          puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)local_118);
          psVar16 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_140.field_2._M_allocated_capacity = *psVar16;
            local_140.field_2._8_8_ = puVar12[3];
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          }
          else {
            local_140.field_2._M_allocated_capacity = *psVar16;
            local_140._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_140._M_string_length = puVar12[1];
          *puVar12 = psVar16;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((ulong *)local_118._0_8_ != &local_108) {
            operator_delete((void *)local_118._0_8_);
          }
          pSVar10 = local_120;
          uVar8 = CompilerGLSL::to_array_size_literal(&pCVar18->super_CompilerGLSL,local_120,1);
          local_d8 = (SPIRType *)CONCAT44(local_d8._4_4_,uVar8);
          pSVar10 = Variant::get<spirv_cross::SPIRType>
                              ((pCVar18->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               (pSVar10->parent_type).id);
          if ((uint)local_d8 != 0) {
            local_f4 = 0;
            do {
              pCVar18 = local_f0;
              (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        ((AccessChainMeta *)local_118,local_f0,pSVar10,0);
              puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)local_118);
              psVar16 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_140.field_2._M_allocated_capacity = *psVar16;
                local_140.field_2._8_8_ = puVar12[3];
                local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar16;
                local_140._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_140._M_string_length = puVar12[1];
              *puVar12 = psVar16;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p);
              }
              if ((ulong *)local_118._0_8_ != &local_108) {
                operator_delete((void *)local_118._0_8_);
              }
              uVar8 = CompilerGLSL::to_array_size_literal(&pCVar18->super_CompilerGLSL,local_120,0);
              if (uVar8 != 0) {
                uVar22 = local_e8 & 0xffffffff;
                uVar21 = 1;
                do {
                  local_90._M_dataplus._M_p._0_4_ = local_f4;
                  local_118._8_8_ = local_118._8_8_ & 0xffffffffffff0000;
                  local_118._0_8_ = (ulong *)0x0;
                  local_90._M_dataplus._M_p._4_4_ = (uint32_t)uVar22;
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            (&local_140,&local_f0->super_CompilerGLSL,
                             (local_f0->stage_in_ptr_var_id).id,(uint32_t *)&local_90,2,5,
                             (AccessChainMeta *)local_118);
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_140._M_dataplus._M_p != &local_140.field_2) {
                    operator_delete(local_140._M_dataplus._M_p);
                  }
                  bVar4 = Compiler::is_matrix((Compiler *)local_f0,pSVar10);
                  if ((!bVar4 && pSVar10->basetype != Struct) &&
                     (pSVar10->vecsize < local_68->vecsize)) {
                    CompilerGLSL::vector_swizzle(pSVar10->vecsize,0);
                    ::std::__cxx11::string::append((char *)&local_b0);
                  }
                  if (uVar21 < uVar8) {
                    ::std::__cxx11::string::append((char *)&local_b0);
                  }
                  uVar22 = (ulong)((uint32_t)uVar22 + 1);
                  bVar4 = uVar21 != uVar8;
                  uVar21 = uVar21 + 1;
                } while (bVar4);
              }
              ::std::__cxx11::string::append((char *)&local_b0);
              local_f4 = local_f4 + 1;
              if (local_f4 < (uint)local_d8) {
                ::std::__cxx11::string::append((char *)&local_b0);
              }
            } while (local_f4 != (uint)local_d8);
          }
          ::std::__cxx11::string::append((char *)&local_b0);
          goto LAB_001ca192;
        }
      }
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar15,"Cannot load array-of-array of composite type in tessellation IO.");
LAB_001ca2ac:
      *(undefined ***)prVar15 = &PTR__runtime_error_003a2f80;
      __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (local_120->basetype != Struct) {
      bVar4 = Compiler::is_matrix((Compiler *)local_f0,local_120);
      if (bVar4) {
        bVar4 = Compiler::is_array((Compiler *)local_f0,local_120);
        pCVar18 = local_f0;
        pSVar10 = local_120;
        if ((TVar2 != TypeVariable) && (bVar4)) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar15,
                     "Loading array of matrix from IO variable must come directly from IO variable."
                    );
LAB_001ca361:
          *(undefined ***)prVar15 = &PTR__runtime_error_003a2f80;
          __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((int)local_e8 == -1) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar15,"Interface index is unknown. Cannot continue.");
          goto LAB_001ca361;
        }
        if (bVar4) {
          local_f4 = CompilerGLSL::to_array_size_literal(&local_f0->super_CompilerGLSL,local_120,0);
          (*(pCVar18->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_118,pCVar18,pSVar10,0);
          puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)local_118);
          paVar1 = &local_140.field_2;
          psVar16 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_140.field_2._M_allocated_capacity = *psVar16;
            local_140.field_2._8_8_ = puVar12[3];
            local_140._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_140.field_2._M_allocated_capacity = *psVar16;
            local_140._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_140._M_string_length = puVar12[1];
          *puVar12 = psVar16;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != paVar1) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((ulong *)local_118._0_8_ != &local_108) {
            operator_delete((void *)local_118._0_8_);
          }
          var = Variant::get<spirv_cross::SPIRVariable>
                          ((pCVar18->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + ptr);
          local_d8 = Compiler::get_variable_element_type((Compiler *)local_f0,var);
          if (local_f4 != 0) {
            uVar8 = 0;
            do {
              (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        ((AccessChainMeta *)local_118,local_f0,local_d8,0);
              puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)local_118);
              psVar16 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_140.field_2._M_allocated_capacity = *psVar16;
                local_140.field_2._8_8_ = puVar12[3];
                local_140._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar16;
                local_140._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_140._M_string_length = puVar12[1];
              *puVar12 = psVar16;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != paVar1) {
                operator_delete(local_140._M_dataplus._M_p);
              }
              if ((ulong *)local_118._0_8_ != &local_108) {
                operator_delete((void *)local_118._0_8_);
              }
              if (local_120->columns != 0) {
                uVar21 = 0;
                do {
                  local_90._M_dataplus._M_p._4_4_ = (int)local_e8 + uVar21;
                  local_118._8_8_ = local_118._8_8_ & 0xffffffffffff0000;
                  local_118._0_8_ = (ulong *)0x0;
                  local_90._M_dataplus._M_p._0_4_ = uVar8;
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            (&local_140,&local_f0->super_CompilerGLSL,
                             (local_f0->stage_in_ptr_var_id).id,(uint32_t *)&local_90,2,5,
                             (AccessChainMeta *)local_118);
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_140._M_dataplus._M_p != paVar1) {
                    operator_delete(local_140._M_dataplus._M_p);
                  }
                  if (local_120->vecsize < local_68->vecsize) {
                    CompilerGLSL::vector_swizzle(local_120->vecsize,0);
                    ::std::__cxx11::string::append((char *)&local_b0);
                  }
                  uVar21 = uVar21 + 1;
                  uVar9 = local_120->columns;
                  if (uVar21 < uVar9) {
                    ::std::__cxx11::string::append((char *)&local_b0);
                    uVar9 = local_120->columns;
                  }
                } while (uVar21 < uVar9);
              }
              ::std::__cxx11::string::append((char *)&local_b0);
              uVar8 = uVar8 + 1;
              if (uVar8 < local_f4) {
                ::std::__cxx11::string::append((char *)&local_b0);
              }
            } while (uVar8 != local_f4);
          }
          ::std::__cxx11::string::append((char *)&local_b0);
        }
        else {
          (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (local_118,local_f0,local_120,0);
          puVar12 = (undefined8 *)::std::__cxx11::string::append(local_118);
          paVar1 = &local_140.field_2;
          psVar16 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_140.field_2._M_allocated_capacity = *psVar16;
            local_140.field_2._8_8_ = puVar12[3];
            local_140._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_140.field_2._M_allocated_capacity = *psVar16;
            local_140._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_140._M_string_length = puVar12[1];
          *puVar12 = psVar16;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != paVar1) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if ((ulong *)local_118._0_8_ != &local_108) {
            operator_delete((void *)local_118._0_8_);
          }
          if (local_120->columns != 0) {
            uVar21 = 0;
            do {
              CompilerGLSL::to_expression_abi_cxx11_
                        (&local_90,&local_f0->super_CompilerGLSL,local_dc,true);
              puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_90);
              puVar17 = puVar12 + 2;
              if ((ulong *)*puVar12 == puVar17) {
                local_108 = *puVar17;
                lStack_100 = puVar12[3];
                local_118._0_8_ = &local_108;
              }
              else {
                local_108 = *puVar17;
                local_118._0_8_ = (ulong *)*puVar12;
              }
              local_118._8_8_ = puVar12[1];
              *puVar12 = puVar17;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              CompilerGLSL::to_member_name_abi_cxx11_
                        (&local_d0,&local_f0->super_CompilerGLSL,local_60,(int)local_e8 + uVar21);
              uVar22 = 0xf;
              if ((ulong *)local_118._0_8_ != &local_108) {
                uVar22 = local_108;
              }
              if (uVar22 < local_d0._M_string_length + local_118._8_8_) {
                uVar19 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  uVar19 = local_d0.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar19 < local_d0._M_string_length + local_118._8_8_) goto LAB_001c9a36;
                puVar12 = (undefined8 *)
                          ::std::__cxx11::string::replace
                                    ((ulong)&local_d0,0,(char *)0x0,local_118._0_8_);
              }
              else {
LAB_001c9a36:
                puVar12 = (undefined8 *)
                          ::std::__cxx11::string::_M_append
                                    (local_118,(ulong)local_d0._M_dataplus._M_p);
              }
              psVar16 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_140.field_2._M_allocated_capacity = *psVar16;
                local_140.field_2._8_8_ = puVar12[3];
                local_140._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar16;
                local_140._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_140._M_string_length = puVar12[1];
              *puVar12 = psVar16;
              puVar12[1] = 0;
              *(undefined1 *)psVar16 = 0;
              ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != paVar1) {
                operator_delete(local_140._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              if ((ulong *)local_118._0_8_ != &local_108) {
                operator_delete((void *)local_118._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint32_t)local_90._M_dataplus._M_p)
                  != &local_90.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                         (uint32_t)local_90._M_dataplus._M_p));
              }
              if (local_120->vecsize < local_68->vecsize) {
                CompilerGLSL::vector_swizzle(local_120->vecsize,0);
                ::std::__cxx11::string::append((char *)&local_b0);
              }
              uVar21 = uVar21 + 1;
              uVar9 = local_120->columns;
              if (uVar21 < uVar9) {
                ::std::__cxx11::string::append((char *)&local_b0);
                uVar9 = local_120->columns;
              }
            } while (uVar21 < uVar9);
          }
          ::std::__cxx11::string::append((char *)&local_b0);
        }
      }
      else if (TVar2 == TypeVariable) {
        bVar4 = Compiler::is_array((Compiler *)local_f0,local_120);
        pCVar18 = local_f0;
        if (!bVar4) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                        ,0x2009,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                        ,0x200a,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((int)local_e8 == -1) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar15,"Interface index is unknown. Cannot continue.");
          goto LAB_001ca2ac;
        }
        (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_118,local_f0,local_120,0);
        puVar12 = (undefined8 *)::std::__cxx11::string::append(local_118);
        paVar1 = &local_140.field_2;
        psVar16 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_140.field_2._M_allocated_capacity = *psVar16;
          local_140.field_2._8_8_ = puVar12[3];
          local_140._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar16;
          local_140._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_140._M_string_length = puVar12[1];
        *puVar12 = psVar16;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if ((ulong *)local_118._0_8_ != &local_108) {
          operator_delete((void *)local_118._0_8_);
        }
        uVar8 = CompilerGLSL::to_array_size_literal(&pCVar18->super_CompilerGLSL,local_120,0);
        if (uVar8 != 0) {
          uVar7 = 0;
          do {
            local_90._M_dataplus._M_p._4_4_ = (uint32_t)local_e8;
            local_118._8_8_ = local_118._8_8_ & 0xffffffffffff0000;
            local_118._0_8_ = (ulong *)0x0;
            local_90._M_dataplus._M_p._0_4_ = uVar7;
            CompilerGLSL::access_chain_internal_abi_cxx11_
                      (&local_140,&local_f0->super_CompilerGLSL,(local_f0->stage_in_ptr_var_id).id,
                       (uint32_t *)&local_90,2,5,(AccessChainMeta *)local_118);
            ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != paVar1) {
              operator_delete(local_140._M_dataplus._M_p);
            }
            if (local_120->vecsize < local_68->vecsize) {
              CompilerGLSL::vector_swizzle(local_120->vecsize,0);
              ::std::__cxx11::string::append((char *)&local_b0);
            }
            uVar7 = uVar7 + 1;
            if (uVar7 < uVar8) {
              ::std::__cxx11::string::append((char *)&local_b0);
            }
          } while (uVar8 != uVar7);
        }
        ::std::__cxx11::string::append((char *)&local_b0);
      }
      else {
        bVar4 = Compiler::is_array((Compiler *)local_f0,local_120);
        pCVar18 = local_f0;
        if (!bVar4) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                        ,0x2025,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                        ,0x2026,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((int)local_e8 == -1) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar15,"Interface index is unknown. Cannot continue.");
          goto LAB_001ca2ac;
        }
        (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_118,local_f0,local_120,0);
        puVar12 = (undefined8 *)::std::__cxx11::string::append(local_118);
        paVar1 = &local_140.field_2;
        psVar16 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_140.field_2._M_allocated_capacity = *psVar16;
          local_140.field_2._8_8_ = puVar12[3];
          local_140._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar16;
          local_140._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_140._M_string_length = puVar12[1];
        *puVar12 = psVar16;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if ((ulong *)local_118._0_8_ != &local_108) {
          operator_delete((void *)local_118._0_8_);
        }
        uVar8 = CompilerGLSL::to_array_size_literal(&pCVar18->super_CompilerGLSL,local_120,0);
        if (uVar8 != 0) {
          uVar21 = 0;
          do {
            CompilerGLSL::to_expression_abi_cxx11_
                      (&local_90,&local_f0->super_CompilerGLSL,local_dc,true);
            puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_90);
            puVar17 = puVar12 + 2;
            if ((ulong *)*puVar12 == puVar17) {
              local_108 = *puVar17;
              lStack_100 = puVar12[3];
              local_118._0_8_ = &local_108;
            }
            else {
              local_108 = *puVar17;
              local_118._0_8_ = (ulong *)*puVar12;
            }
            local_118._8_8_ = puVar12[1];
            *puVar12 = puVar17;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&local_d0,&local_f0->super_CompilerGLSL,local_60,(int)local_e8 + uVar21);
            uVar22 = 0xf;
            if ((ulong *)local_118._0_8_ != &local_108) {
              uVar22 = local_108;
            }
            if (uVar22 < local_d0._M_string_length + local_118._8_8_) {
              uVar19 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                uVar19 = local_d0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar19 < local_d0._M_string_length + local_118._8_8_) goto LAB_001ca077;
              puVar12 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&local_d0,0,(char *)0x0,local_118._0_8_);
            }
            else {
LAB_001ca077:
              puVar12 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  (local_118,(ulong)local_d0._M_dataplus._M_p);
            }
            psVar16 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_140.field_2._M_allocated_capacity = *psVar16;
              local_140.field_2._8_8_ = puVar12[3];
              local_140._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_140.field_2._M_allocated_capacity = *psVar16;
              local_140._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_140._M_string_length = puVar12[1];
            *puVar12 = psVar16;
            puVar12[1] = 0;
            *(undefined1 *)psVar16 = 0;
            ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != paVar1) {
              operator_delete(local_140._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
            if ((ulong *)local_118._0_8_ != &local_108) {
              operator_delete((void *)local_118._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint32_t)local_90._M_dataplus._M_p) !=
                &local_90.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                       (uint32_t)local_90._M_dataplus._M_p));
            }
            if (local_120->vecsize < local_68->vecsize) {
              CompilerGLSL::vector_swizzle(local_120->vecsize,0);
              ::std::__cxx11::string::append((char *)&local_b0);
            }
            uVar21 = uVar21 + 1;
            if (uVar21 < uVar8) {
              ::std::__cxx11::string::append((char *)&local_b0);
            }
          } while (uVar8 != uVar21);
        }
        ::std::__cxx11::string::append((char *)&local_b0);
      }
      goto LAB_001ca192;
    }
    bVar4 = Compiler::is_array((Compiler *)local_f0,local_120);
    pSVar10 = local_120;
    local_f4 = CONCAT31(local_f4._1_3_,bVar4);
    if ((TVar2 != TypeVariable) && (bVar4)) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar15,
                 "Loading array of struct from IO variable must come directly from IO variable.");
      *(undefined ***)prVar15 = &PTR__runtime_error_003a2f80;
      __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (bVar4) {
      local_6c = CompilerGLSL::to_array_size_literal(&pCVar18->super_CompilerGLSL,local_120,0);
      (*(pCVar18->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_118,pCVar18,pSVar10,0);
      puVar12 = (undefined8 *)::std::__cxx11::string::append(local_118);
      psVar16 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_140.field_2._M_allocated_capacity = *psVar16;
        local_140.field_2._8_8_ = puVar12[3];
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      }
      else {
        local_140.field_2._M_allocated_capacity = *psVar16;
        local_140._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_140._M_string_length = puVar12[1];
      *puVar12 = psVar16;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      if ((ulong *)local_118._0_8_ != &local_108) {
        operator_delete((void *)local_118._0_8_);
      }
      local_120 = Variant::get<spirv_cross::SPIRType>
                            ((pCVar18->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             (local_120->parent_type).id);
      if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 0) {
LAB_001ca308:
        __assert_fail("struct_type.array.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                      ,0x1f75,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                     );
      }
      if (local_6c != 0) goto LAB_001c8d4e;
    }
    else {
      local_6c = 1;
      if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 0) goto LAB_001ca308;
LAB_001c8d4e:
      local_d8 = (SPIRType *)0x0;
      pCVar18 = local_f0;
      do {
        (*(pCVar18->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_118,pCVar18,local_120,0);
        puVar12 = (undefined8 *)::std::__cxx11::string::append(local_118);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        psVar16 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_140.field_2._M_allocated_capacity = *psVar16;
          local_140.field_2._8_8_ = puVar12[3];
        }
        else {
          local_140.field_2._M_allocated_capacity = *psVar16;
          local_140._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_140._M_string_length = puVar12[1];
        *puVar12 = psVar16;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        if ((ulong *)local_118._0_8_ != &local_108) {
          operator_delete((void *)local_118._0_8_);
        }
        if ((int)(local_120->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size != 0) {
          uVar22 = 0;
          do {
            if (local_40 != (SPIRVariable *)0x0) {
              uVar8 = Compiler::get_extended_member_decoration
                                ((Compiler *)pCVar18,(local_40->super_IVariant).self.id,
                                 (uint32_t)uVar22,SPIRVCrossDecorationInterfaceMemberIndex);
              local_e8 = CONCAT44(extraout_var_00,uVar8);
            }
            if ((int)local_e8 == -1) {
              prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::runtime_error::runtime_error
                        (prVar15,"Interface index is unknown. Cannot continue.");
              *(undefined ***)prVar15 = &PTR__runtime_error_003a2f80;
              __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            pSVar10 = Variant::get<spirv_cross::SPIRType>
                                ((pCVar18->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 (local_120->member_types).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                                 [uVar22].id);
            local_38 = uVar22;
            pSVar11 = Variant::get<spirv_cross::SPIRType>
                                ((pCVar18->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 (local_68->member_types).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                                 [uVar22].id);
            bVar4 = Compiler::is_matrix((Compiler *)pCVar18,pSVar10);
            if (bVar4 && local_50->storage == StorageClassInput) {
              (*(pCVar18->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (local_118,pCVar18,pSVar10,0);
              puVar12 = (undefined8 *)::std::__cxx11::string::append(local_118);
              local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
              psVar16 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_140.field_2._M_allocated_capacity = *psVar16;
                local_140.field_2._8_8_ = puVar12[3];
              }
              else {
                local_140.field_2._M_allocated_capacity = *psVar16;
                local_140._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_140._M_string_length = puVar12[1];
              *puVar12 = psVar16;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p);
              }
              if ((ulong *)local_118._0_8_ != &local_108) {
                operator_delete((void *)local_118._0_8_);
              }
              if (pSVar10->columns != 0) {
                uVar21 = 0;
                do {
                  uVar8 = (int)local_e8 + uVar21;
                  if ((char)local_f4 == '\0') {
                    CompilerGLSL::to_expression_abi_cxx11_
                              (&local_90,&pCVar18->super_CompilerGLSL,local_dc,true);
                    plVar13 = (long *)::std::__cxx11::string::append((char *)&local_90);
                    local_118._0_8_ = &local_108;
                    puVar17 = (ulong *)(plVar13 + 2);
                    if ((ulong *)*plVar13 == puVar17) {
                      local_108 = *puVar17;
                      lStack_100 = plVar13[3];
                    }
                    else {
                      local_108 = *puVar17;
                      local_118._0_8_ = (ulong *)*plVar13;
                    }
                    local_118._8_8_ = plVar13[1];
                    *plVar13 = (long)puVar17;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    CompilerGLSL::to_member_name_abi_cxx11_
                              (&local_d0,&pCVar18->super_CompilerGLSL,local_60,uVar8);
                    uVar22 = 0xf;
                    if ((ulong *)local_118._0_8_ != &local_108) {
                      uVar22 = local_108;
                    }
                    if (uVar22 < local_d0._M_string_length + local_118._8_8_) {
                      uVar19 = 0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                        uVar19 = local_d0.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar19 < local_d0._M_string_length + local_118._8_8_)
                      goto LAB_001c91dd;
                      puVar12 = (undefined8 *)
                                ::std::__cxx11::string::replace
                                          ((ulong)&local_d0,0,(char *)0x0,local_118._0_8_);
                    }
                    else {
LAB_001c91dd:
                      puVar12 = (undefined8 *)
                                ::std::__cxx11::string::_M_append
                                          (local_118,(ulong)local_d0._M_dataplus._M_p);
                    }
                    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                    psVar16 = puVar12 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar12 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar16) {
                      local_140.field_2._M_allocated_capacity = *psVar16;
                      local_140.field_2._8_8_ = puVar12[3];
                    }
                    else {
                      local_140.field_2._M_allocated_capacity = *psVar16;
                      local_140._M_dataplus._M_p = (pointer)*puVar12;
                    }
                    local_140._M_string_length = puVar12[1];
                    *puVar12 = psVar16;
                    puVar12[1] = 0;
                    *(undefined1 *)psVar16 = 0;
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_140._M_dataplus._M_p != &local_140.field_2) {
                      operator_delete(local_140._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                      operator_delete(local_d0._M_dataplus._M_p);
                    }
                    if ((ulong *)local_118._0_8_ != &local_108) {
                      operator_delete((void *)local_118._0_8_);
                    }
                    _Var20._M_p = (pointer)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                    (uint32_t)local_90._M_dataplus._M_p);
                    psVar3 = &local_90;
                  }
                  else {
                    local_90._M_dataplus._M_p._0_4_ = (uint32_t)local_d8;
                    local_118._8_8_ = local_118._8_8_ & 0xffffffffffff0000;
                    local_118._0_8_ = (ulong *)0x0;
                    local_90._M_dataplus._M_p._4_4_ = uVar8;
                    CompilerGLSL::access_chain_internal_abi_cxx11_
                              (&local_140,&pCVar18->super_CompilerGLSL,
                               (pCVar18->stage_in_ptr_var_id).id,(uint32_t *)&local_90,2,5,
                               (AccessChainMeta *)local_118);
                    ::std::__cxx11::string::_M_append
                              ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                    psVar3 = &local_140;
                    _Var20._M_p = local_140._M_dataplus._M_p;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var20._M_p != &psVar3->field_2) {
                    operator_delete(_Var20._M_p);
                  }
                  if (pSVar10->vecsize < pSVar11->vecsize) {
                    CompilerGLSL::vector_swizzle(pSVar10->vecsize,0);
                    ::std::__cxx11::string::append((char *)&local_b0);
                  }
                  uVar21 = uVar21 + 1;
                  uVar9 = pSVar10->columns;
                  if (uVar21 < uVar9) {
                    ::std::__cxx11::string::append((char *)&local_b0);
                    uVar9 = pSVar10->columns;
                  }
                } while (uVar21 < uVar9);
                local_e8 = (ulong)((int)local_e8 + uVar21);
              }
              ::std::__cxx11::string::append((char *)&local_b0);
            }
            else {
              bVar4 = Compiler::is_array((Compiler *)pCVar18,pSVar10);
              if (bVar4) {
                (*(pCVar18->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (local_118,pCVar18,pSVar10,0);
                puVar12 = (undefined8 *)::std::__cxx11::string::append(local_118);
                local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                psVar16 = puVar12 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar16) {
                  local_140.field_2._M_allocated_capacity = *psVar16;
                  local_140.field_2._8_8_ = puVar12[3];
                }
                else {
                  local_140.field_2._M_allocated_capacity = *psVar16;
                  local_140._M_dataplus._M_p = (pointer)*puVar12;
                }
                local_140._M_string_length = puVar12[1];
                *puVar12 = psVar16;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                ::std::__cxx11::string::_M_append
                          ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_140._M_dataplus._M_p != &local_140.field_2) {
                  operator_delete(local_140._M_dataplus._M_p);
                }
                if ((ulong *)local_118._0_8_ != &local_108) {
                  operator_delete((void *)local_118._0_8_);
                }
                uVar8 = CompilerGLSL::to_array_size_literal(&pCVar18->super_CompilerGLSL,pSVar10,0);
                if (uVar8 != 0) {
                  uVar21 = 1;
                  do {
                    if ((char)local_f4 == '\0') {
                      CompilerGLSL::to_expression_abi_cxx11_
                                (&local_90,&local_f0->super_CompilerGLSL,local_dc,true);
                      puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_90);
                      local_118._0_8_ = &local_108;
                      puVar17 = puVar12 + 2;
                      if ((ulong *)*puVar12 == puVar17) {
                        local_108 = *puVar17;
                        lStack_100 = puVar12[3];
                      }
                      else {
                        local_108 = *puVar17;
                        local_118._0_8_ = (ulong *)*puVar12;
                      }
                      local_118._8_8_ = puVar12[1];
                      *puVar12 = puVar17;
                      puVar12[1] = 0;
                      *(undefined1 *)(puVar12 + 2) = 0;
                      CompilerGLSL::to_member_name_abi_cxx11_
                                (&local_d0,&local_f0->super_CompilerGLSL,local_60,(uint32_t)local_e8
                                );
                      uVar22 = 0xf;
                      if ((ulong *)local_118._0_8_ != &local_108) {
                        uVar22 = local_108;
                      }
                      if (uVar22 < local_d0._M_string_length + local_118._8_8_) {
                        uVar19 = 0xf;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                          uVar19 = local_d0.field_2._M_allocated_capacity;
                        }
                        if ((ulong)uVar19 < local_d0._M_string_length + local_118._8_8_)
                        goto LAB_001c9562;
                        puVar12 = (undefined8 *)
                                  ::std::__cxx11::string::replace
                                            ((ulong)&local_d0,0,(char *)0x0,local_118._0_8_);
                      }
                      else {
LAB_001c9562:
                        puVar12 = (undefined8 *)
                                  ::std::__cxx11::string::_M_append
                                            (local_118,(ulong)local_d0._M_dataplus._M_p);
                      }
                      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                      psVar16 = puVar12 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar12 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar16) {
                        local_140.field_2._M_allocated_capacity = *psVar16;
                        local_140.field_2._8_8_ = puVar12[3];
                      }
                      else {
                        local_140.field_2._M_allocated_capacity = *psVar16;
                        local_140._M_dataplus._M_p = (pointer)*puVar12;
                      }
                      local_140._M_string_length = puVar12[1];
                      *puVar12 = psVar16;
                      puVar12[1] = 0;
                      *(undefined1 *)psVar16 = 0;
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_140._M_dataplus._M_p != &local_140.field_2) {
                        operator_delete(local_140._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                        operator_delete(local_d0._M_dataplus._M_p);
                      }
                      if ((ulong *)local_118._0_8_ != &local_108) {
                        operator_delete((void *)local_118._0_8_);
                      }
                      _Var20._M_p = (pointer)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                      (uint32_t)local_90._M_dataplus._M_p);
                      psVar3 = &local_90;
                    }
                    else {
                      local_90._M_dataplus._M_p._0_4_ = (uint32_t)local_d8;
                      local_90._M_dataplus._M_p._4_4_ = (uint32_t)local_e8;
                      local_118._8_8_ = local_118._8_8_ & 0xffffffffffff0000;
                      local_118._0_8_ = (ulong *)0x0;
                      CompilerGLSL::access_chain_internal_abi_cxx11_
                                (&local_140,&local_f0->super_CompilerGLSL,
                                 (local_f0->stage_in_ptr_var_id).id,(uint32_t *)&local_90,2,5,
                                 (AccessChainMeta *)local_118);
                      ::std::__cxx11::string::_M_append
                                ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                      psVar3 = &local_140;
                      _Var20._M_p = local_140._M_dataplus._M_p;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var20._M_p != &psVar3->field_2) {
                      operator_delete(_Var20._M_p);
                    }
                    if (pSVar10->vecsize < pSVar11->vecsize) {
                      CompilerGLSL::vector_swizzle(pSVar10->vecsize,0);
                      ::std::__cxx11::string::append((char *)&local_b0);
                    }
                    if (uVar21 < uVar8) {
                      ::std::__cxx11::string::append((char *)&local_b0);
                    }
                    local_e8 = (ulong)((int)local_e8 + 1);
                    bVar4 = uVar21 != uVar8;
                    uVar21 = uVar21 + 1;
                  } while (bVar4);
                }
                ::std::__cxx11::string::append((char *)&local_b0);
                pCVar18 = local_f0;
              }
              else {
                if ((char)local_f4 == '\0') {
                  CompilerGLSL::to_expression_abi_cxx11_
                            (&local_90,&pCVar18->super_CompilerGLSL,local_dc,true);
                  puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_90);
                  puVar17 = puVar12 + 2;
                  if ((ulong *)*puVar12 == puVar17) {
                    local_108 = *puVar17;
                    lStack_100 = puVar12[3];
                    local_118._0_8_ = &local_108;
                  }
                  else {
                    local_108 = *puVar17;
                    local_118._0_8_ = (ulong *)*puVar12;
                  }
                  local_118._8_8_ = puVar12[1];
                  *puVar12 = puVar17;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  CompilerGLSL::to_member_name_abi_cxx11_
                            (&local_d0,&pCVar18->super_CompilerGLSL,local_60,(uint32_t)local_e8);
                  uVar22 = 0xf;
                  if ((ulong *)local_118._0_8_ != &local_108) {
                    uVar22 = local_108;
                  }
                  if (uVar22 < local_d0._M_string_length + local_118._8_8_) {
                    uVar19 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                      uVar19 = local_d0.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar19 < local_d0._M_string_length + local_118._8_8_)
                    goto LAB_001c9738;
                    puVar12 = (undefined8 *)
                              ::std::__cxx11::string::replace
                                        ((ulong)&local_d0,0,(char *)0x0,local_118._0_8_);
                  }
                  else {
LAB_001c9738:
                    puVar12 = (undefined8 *)
                              ::std::__cxx11::string::_M_append
                                        (local_118,(ulong)local_d0._M_dataplus._M_p);
                  }
                  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
                  psVar16 = puVar12 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar12 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar16) {
                    local_140.field_2._M_allocated_capacity = *psVar16;
                    local_140.field_2._8_8_ = puVar12[3];
                  }
                  else {
                    local_140.field_2._M_allocated_capacity = *psVar16;
                    local_140._M_dataplus._M_p = (pointer)*puVar12;
                  }
                  local_140._M_string_length = puVar12[1];
                  *puVar12 = psVar16;
                  puVar12[1] = 0;
                  *(undefined1 *)psVar16 = 0;
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_140._M_dataplus._M_p != &local_140.field_2) {
                    operator_delete(local_140._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                    operator_delete(local_d0._M_dataplus._M_p);
                  }
                  if ((ulong *)local_118._0_8_ != &local_108) {
                    operator_delete((void *)local_118._0_8_);
                  }
                  _Var20._M_p = (pointer)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                  (uint32_t)local_90._M_dataplus._M_p);
                  psVar3 = &local_90;
                }
                else {
                  local_90._M_dataplus._M_p._0_4_ = (uint32_t)local_d8;
                  local_90._M_dataplus._M_p._4_4_ = (uint32_t)local_e8;
                  local_118._8_8_ = local_118._8_8_ & 0xffffffffffff0000;
                  local_118._0_8_ = (ulong *)0x0;
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            (&local_140,&pCVar18->super_CompilerGLSL,
                             (pCVar18->stage_in_ptr_var_id).id,(uint32_t *)&local_90,2,5,
                             (AccessChainMeta *)local_118);
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
                  psVar3 = &local_140;
                  _Var20._M_p = local_140._M_dataplus._M_p;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var20._M_p != &psVar3->field_2) {
                  operator_delete(_Var20._M_p);
                }
                if (pSVar10->vecsize < pSVar11->vecsize) {
                  CompilerGLSL::vector_swizzle(pSVar10->vecsize,0);
                  ::std::__cxx11::string::append((char *)&local_b0);
                }
              }
            }
            uVar22 = local_38 + 1;
            uVar14 = (local_120->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
            if (uVar22 < uVar14) {
              ::std::__cxx11::string::append((char *)&local_b0);
              uVar14 = (ulong)(uint)(local_120->member_types).
                                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                    buffer_size;
            }
          } while (uVar22 < (uVar14 & 0xffffffff));
        }
        ::std::__cxx11::string::append((char *)&local_b0);
        uVar21 = (int)local_d8 + 1;
        local_d8 = (SPIRType *)(ulong)uVar21;
        if (uVar21 < local_6c) {
          ::std::__cxx11::string::append((char *)&local_b0);
        }
      } while ((uint32_t)local_d8 != local_6c);
      if ((char)local_f4 == '\0') goto LAB_001ca192;
    }
    ::std::__cxx11::string::append((char *)&local_b0);
  }
  else {
    if ((int)local_e8 == -1) {
      bVar4 = false;
      goto LAB_001ca1d2;
    }
    (*(local_f0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (local_118,local_f0,local_120,0);
    puVar12 = (undefined8 *)::std::__cxx11::string::append(local_118);
    paVar1 = &local_140.field_2;
    psVar16 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_140.field_2._M_allocated_capacity = *psVar16;
      local_140.field_2._8_8_ = puVar12[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar16;
      local_140._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_140._M_string_length = puVar12[1];
    *puVar12 = psVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((ulong *)local_118._0_8_ != &local_108) {
      operator_delete((void *)local_118._0_8_);
    }
    uVar8 = CompilerGLSL::to_array_size_literal
                      (&pCVar18->super_CompilerGLSL,local_120,
                       (int)(local_120->array).super_VectorView<unsigned_int>.buffer_size - 1);
    if (uVar8 != 0) {
      uVar7 = 0;
      do {
        local_90._M_dataplus._M_p._4_4_ = (uint32_t)local_e8;
        local_118._8_8_ = local_118._8_8_ & 0xffffffffffff0000;
        local_118._0_8_ = (ulong *)0x0;
        local_90._M_dataplus._M_p._0_4_ = uVar7;
        CompilerGLSL::access_chain_internal_abi_cxx11_
                  (&local_140,&local_f0->super_CompilerGLSL,(local_f0->stage_in_ptr_var_id).id,
                   (uint32_t *)&local_90,2,5,(AccessChainMeta *)local_118);
        ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_140._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        uVar7 = uVar7 + 1;
        if (uVar7 < uVar8) {
          ::std::__cxx11::string::append((char *)&local_b0);
        }
      } while (uVar8 != uVar7);
    }
    ::std::__cxx11::string::append((char *)&local_b0);
  }
LAB_001ca192:
  pCVar18 = local_f0;
  CompilerGLSL::emit_op(&local_f0->super_CompilerGLSL,local_44,local_54,&local_b0,false,false);
  bVar4 = true;
  Compiler::register_read((Compiler *)pCVar18,local_54,local_dc,false);
LAB_001ca1d2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
    return bVar4;
  }
  return bVar4;
}

Assistant:

bool CompilerMSL::emit_tessellation_io_load(uint32_t result_type_id, uint32_t id, uint32_t ptr)
{
	auto &ptr_type = expression_type(ptr);
	auto &result_type = get<SPIRType>(result_type_id);
	if (ptr_type.storage != StorageClassInput && ptr_type.storage != StorageClassOutput)
		return false;
	if (ptr_type.storage == StorageClassOutput && is_tese_shader())
		return false;

	if (has_decoration(ptr, DecorationPatch))
		return false;
	bool ptr_is_io_variable = ir.ids[ptr].get_type() == TypeVariable;

	bool flattened_io = variable_storage_requires_stage_io(ptr_type.storage);

	bool flat_data_type = flattened_io &&
	                      (is_matrix(result_type) || is_array(result_type) || result_type.basetype == SPIRType::Struct);

	// Edge case, even with multi-patch workgroups, we still need to unroll load
	// if we're loading control points directly.
	if (ptr_is_io_variable && is_array(result_type))
		flat_data_type = true;

	if (!flat_data_type)
		return false;

	// Now, we must unflatten a composite type and take care of interleaving array access with gl_in/gl_out.
	// Lots of painful code duplication since we *really* should not unroll these kinds of loads in entry point fixup
	// unless we're forced to do this when the code is emitting inoptimal OpLoads.
	string expr;

	uint32_t interface_index = get_extended_decoration(ptr, SPIRVCrossDecorationInterfaceMemberIndex);
	auto *var = maybe_get_backing_variable(ptr);
	auto &expr_type = get_pointee_type(ptr_type.self);

	const auto &iface_type = expression_type(stage_in_ptr_var_id);

	if (!flattened_io)
	{
		// Simplest case for multi-patch workgroups, just unroll array as-is.
		if (interface_index == uint32_t(-1))
			return false;

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, uint32_t(result_type.array.size()) - 1);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };
			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.array.size() > 2)
	{
		SPIRV_CROSS_THROW("Cannot load tessellation IO variables with more than 2 dimensions.");
	}
	else if (result_type.array.size() == 2)
	{
		if (!ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading an array-of-array must be loaded directly from an IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");
		if (result_type.basetype == SPIRType::Struct || is_matrix(result_type))
			SPIRV_CROSS_THROW("Cannot load array-of-array of composite type in tessellation IO.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 1);
		uint32_t base_interface_index = interface_index;

		auto &sub_type = get<SPIRType>(result_type.parent_type);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(sub_type) + "({ ";
			interface_index = base_interface_index;
			uint32_t array_size = to_array_size_literal(result_type, 0);
			for (uint32_t j = 0; j < array_size; j++, interface_index++)
			{
				const uint32_t indices[2] = { i, interface_index };

				AccessChainMeta meta;
				expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
				                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
				if (!is_matrix(sub_type) && sub_type.basetype != SPIRType::Struct &&
					expr_type.vecsize > sub_type.vecsize)
					expr += vector_swizzle(sub_type.vecsize, 0);

				if (j + 1 < array_size)
					expr += ", ";
			}
			expr += " })";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (result_type.basetype == SPIRType::Struct)
	{
		bool is_array_of_struct = is_array(result_type);
		if (is_array_of_struct && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of struct from IO variable must come directly from IO variable.");

		uint32_t num_control_points = 1;
		if (is_array_of_struct)
		{
			num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";
		}

		auto &struct_type = is_array_of_struct ? get<SPIRType>(result_type.parent_type) : result_type;
		assert(struct_type.array.empty());

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(struct_type) + "{ ";
			for (uint32_t j = 0; j < uint32_t(struct_type.member_types.size()); j++)
			{
				// The base interface index is stored per variable for structs.
				if (var)
				{
					interface_index =
					    get_extended_member_decoration(var->self, j, SPIRVCrossDecorationInterfaceMemberIndex);
				}

				if (interface_index == uint32_t(-1))
					SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

				const auto &mbr_type = get<SPIRType>(struct_type.member_types[j]);
				const auto &expr_mbr_type = get<SPIRType>(expr_type.member_types[j]);
				if (is_matrix(mbr_type) && ptr_type.storage == StorageClassInput)
				{
					expr += type_to_glsl(mbr_type) + "(";
					for (uint32_t k = 0; k < mbr_type.columns; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < mbr_type.columns)
							expr += ", ";
					}
					expr += ")";
				}
				else if (is_array(mbr_type))
				{
					expr += type_to_glsl(mbr_type) + "({ ";
					uint32_t array_size = to_array_size_literal(mbr_type, 0);
					for (uint32_t k = 0; k < array_size; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
									stage_in_ptr_var_id, indices, 2,
									ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < array_size)
							expr += ", ";
					}
					expr += " })";
				}
				else
				{
					if (is_array_of_struct)
					{
						const uint32_t indices[2] = { i, interface_index };
						AccessChainMeta meta;
						expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
						                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT,
						                              &meta);
					}
					else
						expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
					if (expr_mbr_type.vecsize > mbr_type.vecsize)
						expr += vector_swizzle(mbr_type.vecsize, 0);
				}

				if (j + 1 < struct_type.member_types.size())
					expr += ", ";
			}
			expr += " }";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		if (is_array_of_struct)
			expr += " })";
	}
	else if (is_matrix(result_type))
	{
		bool is_array_of_matrix = is_array(result_type);
		if (is_array_of_matrix && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of matrix from IO variable must come directly from IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		if (is_array_of_matrix)
		{
			// Loading a matrix from each control point.
			uint32_t base_interface_index = interface_index;
			uint32_t num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";

			auto &matrix_type = get_variable_element_type(get<SPIRVariable>(ptr));

			for (uint32_t i = 0; i < num_control_points; i++)
			{
				interface_index = base_interface_index;
				expr += type_to_glsl(matrix_type) + "(";
				for (uint32_t j = 0; j < result_type.columns; j++, interface_index++)
				{
					const uint32_t indices[2] = { i, interface_index };

					AccessChainMeta meta;
					expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
					                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					if (expr_type.vecsize > result_type.vecsize)
						expr += vector_swizzle(result_type.vecsize, 0);
					if (j + 1 < result_type.columns)
						expr += ", ";
				}
				expr += ")";
				if (i + 1 < num_control_points)
					expr += ", ";
			}

			expr += " })";
		}
		else
		{
			expr += type_to_glsl(result_type) + "(";
			for (uint32_t i = 0; i < result_type.columns; i++, interface_index++)
			{
				expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
				if (expr_type.vecsize > result_type.vecsize)
					expr += vector_swizzle(result_type.vecsize, 0);
				if (i + 1 < result_type.columns)
					expr += ", ";
			}
			expr += ")";
		}
	}
	else if (ptr_is_io_variable)
	{
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		// We're loading an array directly from a global variable.
		// This means we're loading one member from each control point.
		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 0);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };

			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);

			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else
	{
		// We're loading an array from a concrete control point.
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t array_size = to_array_size_literal(result_type, 0);
		for (uint32_t i = 0; i < array_size; i++, interface_index++)
		{
			expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);
			if (i + 1 < array_size)
				expr += ", ";
		}
		expr += " })";
	}

	emit_op(result_type_id, id, expr, false);
	register_read(id, ptr, false);
	return true;
}